

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O3

void mtbdd_fprint_leaf(FILE *out,MTBDD leaf)

{
  char *__s;
  long lVar1;
  char buf [64];
  char acStack_58 [64];
  
  lVar1 = (leaf & 0xffffffffff) * 0x10;
  __s = sylvan_mt_to_str((uint)(leaf >> 0x3f),*(uint32_t *)(nodes->data + lVar1),
                         *(uint64_t *)(nodes->data + lVar1 + 8),acStack_58,0x40);
  if (__s != (char *)0x0) {
    fputs(__s,(FILE *)out);
    if (__s != acStack_58) {
      free(__s);
    }
  }
  return;
}

Assistant:

void
mtbdd_fprint_leaf(FILE *out, MTBDD leaf)
{
    char buf[64];
    char *ptr = mtbdd_leaf_to_str(leaf, buf, 64);
    if (ptr != NULL) {
        fputs(ptr, out);
        if (ptr != buf) free(ptr);
    }
}